

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invert.c
# Opt level: O0

void opj_lupSolve(OPJ_FLOAT32 *pResult,OPJ_FLOAT32 *pMatrix,OPJ_FLOAT32 *pVector,
                 OPJ_UINT32 *pPermutations,OPJ_UINT32 nb_compo,OPJ_FLOAT32 *p_intermediate_data)

{
  uint *local_90;
  OPJ_UINT32 *lCurrentPermutationPtr;
  OPJ_FLOAT32 *lGeneratedData;
  OPJ_FLOAT32 *lBeginPtr;
  OPJ_FLOAT32 *lLineMatrix;
  OPJ_FLOAT32 *lTmpMatrix;
  OPJ_FLOAT32 *lDestPtr;
  OPJ_FLOAT32 *lIntermediatePtr;
  OPJ_FLOAT32 *lCurrentPtr;
  OPJ_UINT32 lStride;
  OPJ_FLOAT32 u;
  OPJ_FLOAT32 sum;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_INT32 k;
  OPJ_FLOAT32 *p_intermediate_data_local;
  OPJ_UINT32 nb_compo_local;
  OPJ_UINT32 *pPermutations_local;
  OPJ_FLOAT32 *pVector_local;
  OPJ_FLOAT32 *pMatrix_local;
  OPJ_FLOAT32 *pResult_local;
  
  lGeneratedData = pResult + nb_compo;
  lCurrentPermutationPtr = (OPJ_UINT32 *)(p_intermediate_data + nb_compo);
  local_90 = pPermutations;
  lBeginPtr = pMatrix;
  lDestPtr = p_intermediate_data;
  for (sum = 0.0; (uint)sum < nb_compo; sum = (OPJ_FLOAT32)((int)sum + 1)) {
    lStride = 0;
    lLineMatrix = lBeginPtr;
    lIntermediatePtr = p_intermediate_data;
    for (u = 1.4013e-45; (uint)u <= (uint)sum; u = (OPJ_FLOAT32)((int)u + 1)) {
      lStride = (OPJ_UINT32)((float)*lLineMatrix * (float)*lIntermediatePtr + (float)lStride);
      lLineMatrix = lLineMatrix + 1;
      lIntermediatePtr = lIntermediatePtr + 1;
    }
    *lDestPtr = (OPJ_FLOAT32)((float)pVector[*local_90] - (float)lStride);
    lBeginPtr = lBeginPtr + nb_compo;
    local_90 = local_90 + 1;
    lDestPtr = lDestPtr + 1;
  }
  lBeginPtr = pMatrix + ((ulong)(nb_compo * nb_compo) - 1);
  if (nb_compo != 0) {
    lTmpMatrix = pResult + nb_compo;
    for (j = nb_compo - 1; lGeneratedData = lGeneratedData + -1,
        lCurrentPermutationPtr = (OPJ_UINT32 *)((OPJ_FLOAT32 *)lCurrentPermutationPtr + -1),
        j != 0xffffffff; j = j - 1) {
      lStride = 0;
      lIntermediatePtr = lTmpMatrix;
      lLineMatrix = lBeginPtr;
      u = (OPJ_FLOAT32)j;
      while (u = (OPJ_FLOAT32)((int)u + 1), lLineMatrix = lLineMatrix + 1, (uint)u < nb_compo) {
        lStride = (OPJ_UINT32)((float)*lLineMatrix * (float)*lIntermediatePtr + (float)lStride);
        lIntermediatePtr = lIntermediatePtr + 1;
      }
      *lGeneratedData =
           (OPJ_FLOAT32)(((float)*lCurrentPermutationPtr - (float)lStride) / (float)*lBeginPtr);
      lBeginPtr = lBeginPtr + -(ulong)(nb_compo + 1);
      lTmpMatrix = lTmpMatrix + -1;
    }
    return;
  }
  __assert_fail("nb_compo != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/invert.c"
                ,0xfc,
                "void opj_lupSolve(OPJ_FLOAT32 *, OPJ_FLOAT32 *, OPJ_FLOAT32 *, OPJ_UINT32 *, OPJ_UINT32, OPJ_FLOAT32 *)"
               );
}

Assistant:

static void opj_lupSolve(OPJ_FLOAT32 * pResult,
                         OPJ_FLOAT32 * pMatrix,
                         OPJ_FLOAT32 * pVector,
                         OPJ_UINT32* pPermutations,
                         OPJ_UINT32 nb_compo, OPJ_FLOAT32 * p_intermediate_data)
{
    OPJ_INT32 k;
    OPJ_UINT32 i, j;
    OPJ_FLOAT32 sum;
    OPJ_FLOAT32 u;
    OPJ_UINT32 lStride = nb_compo + 1;
    OPJ_FLOAT32 * lCurrentPtr;
    OPJ_FLOAT32 * lIntermediatePtr;
    OPJ_FLOAT32 * lDestPtr;
    OPJ_FLOAT32 * lTmpMatrix;
    OPJ_FLOAT32 * lLineMatrix = pMatrix;
    OPJ_FLOAT32 * lBeginPtr = pResult + nb_compo - 1;
    OPJ_FLOAT32 * lGeneratedData;
    OPJ_UINT32 * lCurrentPermutationPtr = pPermutations;


    lIntermediatePtr = p_intermediate_data;
    lGeneratedData = p_intermediate_data + nb_compo - 1;

    for (i = 0; i < nb_compo; ++i) {
        sum = 0.0;
        lCurrentPtr = p_intermediate_data;
        lTmpMatrix = lLineMatrix;
        for (j = 1; j <= i; ++j) {
            /* sum += matrix[i][j-1] * y[j-1]; */
            sum += (*(lTmpMatrix++)) * (*(lCurrentPtr++));
        }
        /*y[i] = pVector[pPermutations[i]] - sum; */
        *(lIntermediatePtr++) = pVector[*(lCurrentPermutationPtr++)] - sum;
        lLineMatrix += nb_compo;
    }

    /* we take the last point of the matrix */
    lLineMatrix = pMatrix + nb_compo * nb_compo - 1;

    /* and we take after the last point of the destination vector */
    lDestPtr = pResult + nb_compo;


    assert(nb_compo != 0);
    for (k = (OPJ_INT32)nb_compo - 1; k != -1 ; --k) {
        sum = 0.0;
        lTmpMatrix = lLineMatrix;
        u = *(lTmpMatrix++);
        lCurrentPtr = lDestPtr--;
        for (j = (OPJ_UINT32)(k + 1); j < nb_compo; ++j) {
            /* sum += matrix[k][j] * x[j] */
            sum += (*(lTmpMatrix++)) * (*(lCurrentPtr++));
        }
        /*x[k] = (y[k] - sum) / u; */
        *(lBeginPtr--) = (*(lGeneratedData--) - sum) / u;
        lLineMatrix -= lStride;
    }
}